

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpsm_cli_main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  __middle;
  undefined **ppuVar1;
  pointer pcVar2;
  long lVar3;
  string_ref query_00;
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  __first;
  __normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>_*,_std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>
  __last;
  pointer pMVar4;
  pointer pTVar5;
  char cVar6;
  bool bVar7;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar8;
  char *pcVar9;
  typed_value<unsigned_long,_char> *ptVar10;
  const_iterator cVar11;
  long *plVar12;
  istream *piVar13;
  any *paVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  unsigned_long *puVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  ulong uVar18;
  Thread *pTVar19;
  Error *pEVar20;
  code *info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *opts_00;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_00;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_01;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_02;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_03;
  anon_class_48_6_59189e45_for__M_head_impl *extraout_RDX_04;
  anon_class_48_6_59189e45_for__M_head_impl *__args;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  *matches;
  ulong uVar21;
  Thread *other;
  size_type __n;
  pointer __c;
  Matched<cpsm::StringRefItem> *pMVar22;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  *__range3;
  uint uVar23;
  ulong uVar24;
  Thread *this;
  long lVar25;
  pointer pMVar26;
  StringRefItem item;
  StringRefItem item_00;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  all_matches;
  vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> threads;
  vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
  thread_matches;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> crfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  variables_map opts;
  options_description opts_desc;
  vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
  local_3c8;
  vector<cpsm::Thread,_std::allocator<cpsm::Thread>_> local_3a8;
  Thread *local_388;
  basic_option<char> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  pointer local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  Iterator local_2b0;
  thread local_2a8;
  pointer local_288;
  pointer local_238;
  pointer local_210;
  pointer local_1e8;
  char *local_1c8;
  size_t sStack_1c0;
  char local_1b8 [16];
  pointer local_1a8;
  pointer pbStack_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  undefined1 local_178 [24];
  _Rb_tree_node_base local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_b0 [24];
  void *local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_70 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  
  std::ios_base::sync_with_stdio(false);
  std::ios_base::sync_with_stdio(false);
  std::ios_base::sync_with_stdio(false);
  ppuVar1 = (undefined **)(local_2d0 + 0x10);
  local_2d0._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"Options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_d8,(string *)local_2d0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((undefined **)local_2d0._0_8_ != ppuVar1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  local_380.string_key._M_dataplus._M_p =
       (pointer)boost::program_options::options_description::add_options();
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2d0._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  ptVar8 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_2d0);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_380,(value_semantic *)"crfile",(char *)ptVar8);
  ptVar10 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_320._M_dataplus._M_p = (pointer)0xa;
  ptVar10 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar10,(unsigned_long *)&local_320);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"limit",(char *)ptVar10);
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
  ptVar8 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_178);
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"query",(char *)ptVar8);
  boost::program_options::options_description_easy_init::operator()(pcVar9,"help");
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_);
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_178);
  local_58.super_function_base.vtable = (vtable_base *)0x0;
  local_58.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_58.super_function_base.functor._8_8_ = 0;
  local_58.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_2d0,argc,argv,(options_description *)local_d8,0,
             &local_58);
  boost::program_options::store((basic_parsed_options *)local_2d0,(variables_map *)local_178,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_2d0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_58);
  boost::program_options::notify((variables_map *)local_178);
  local_2d0._0_8_ = local_2d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"help","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(local_178 + 0x10),(key_type *)local_2d0);
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if (cVar11._M_node == &local_160) {
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    local_320.field_2._M_local_buf[0] = '\0';
    ppuVar1 = (undefined **)(local_2d0 + 0x10);
    while( true ) {
      local_320._M_string_length = 0;
      cVar6 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
      piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&std::cin,(string *)&local_320,cVar6);
      if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_198,
                 &local_320);
      *local_320._M_dataplus._M_p = '\0';
    }
    local_2d0._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"crfile","");
    paVar14 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    pbVar15 = boost::any_cast<std::__cxx11::string_const&>(paVar14);
    local_300 = &local_2f0;
    pcVar2 = (pbVar15->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,pcVar2,pcVar2 + pbVar15->_M_string_length);
    if ((undefined **)local_2d0._0_8_ != ppuVar1) {
      operator_delete((void *)local_2d0._0_8_);
    }
    local_2d0._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"limit","");
    paVar14 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    puVar16 = boost::any_cast<unsigned_long_const&>(paVar14);
    pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar16;
    if ((undefined **)local_2d0._0_8_ != ppuVar1) {
      operator_delete((void *)local_2d0._0_8_);
    }
    local_2d0._0_8_ = ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"query","");
    paVar14 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_178)
    ;
    pbVar17 = boost::any_cast<std::__cxx11::string_const&>(paVar14);
    local_1c8 = local_1b8;
    pcVar2 = (pbVar17->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar2,pcVar2 + pbVar17->_M_string_length);
    if ((undefined **)local_2d0._0_8_ != ppuVar1) {
      operator_delete((void *)local_2d0._0_8_);
    }
    local_380._39_1_ = 0;
    local_380._35_4_ = 0;
    local_380.string_key._M_dataplus._M_p = (pointer)local_300;
    local_380.string_key._M_string_length = (size_type)local_2f8;
    local_380.string_key.field_2._8_8_ = 0x100000000;
    local_380.position_key._0_2_ = 1;
    local_380.position_key._2_1_ = '\x01';
    local_1a8 = local_198.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pbStack_1a0 = local_198.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_2f0.field_2._M_allocated_capacity = (size_type)local_1c8;
    local_2f0.field_2._8_8_ = sStack_1c0;
    local_380.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_300;
    local_380.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_2f8;
    local_380.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    info = (code *)local_300;
    local_380.string_key.field_2._M_allocated_capacity = (size_type)pbVar15;
    std::
    vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
    ::vector((vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
              *)((long)&local_380.original_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 8),1,(allocator_type *)local_2d0);
    local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_start = (Thread *)0x0;
    local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (Thread *)0x0;
    local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Thread *)0x0;
    std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::reserve
              (&local_3a8,(ulong)local_380.string_key.field_2._8_8_ >> 0x20);
    if (local_380.string_key.field_2._12_4_ != 0) {
      uVar23 = 0;
      __args = extraout_RDX;
      do {
        pTVar5 = local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_2c0._M_allocated_capacity = (size_type)&local_1a8;
        local_2a8._M_id._M_thread =
             (id)((long)&local_380.original_tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + 8);
        local_2d0._0_4_ = uVar23;
        local_2d0._8_8_ = &local_380;
        local_2c0._8_8_ = &local_2f0.field_2;
        local_2b0._M_current = (char *)&local_380.value;
        if (local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_388 = local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          if ((long)local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar25 = (long)local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4;
          uVar21 = lVar25 * -0x5555555555555555;
          uVar18 = uVar21 + (uVar21 == 0);
          uVar24 = uVar18 + uVar21;
          info = (code *)0x2aaaaaaaaaaaaaa;
          if (0x2aaaaaaaaaaaaa9 < uVar24) {
            uVar24 = 0x2aaaaaaaaaaaaaa;
          }
          if (CARRY8(uVar18,uVar21)) {
            uVar24 = 0x2aaaaaaaaaaaaaa;
          }
          if (uVar24 == 0) {
            pTVar19 = (Thread *)0x0;
          }
          else {
            pTVar19 = __gnu_cxx::new_allocator<cpsm::Thread>::allocate
                                ((new_allocator<cpsm::Thread> *)&local_3a8,uVar24,(void *)0x0);
            __args = extraout_RDX_01;
          }
          std::allocator_traits<std::allocator<cpsm::Thread>>::
          construct<cpsm::Thread,cpsm::detail::for_each_match<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits,cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>(boost::basic_string_ref<char,std::char_traits<char>>,cpsm::Options_const&,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>&&,main::__0&&)::_lambda()_1_>
                    ((allocator_type *)(&(pTVar19->exception_msg_)._M_dataplus + lVar25 * 2),
                     (Thread *)local_2d0,__args);
          __args = extraout_RDX_02;
          this = pTVar19;
          for (other = local_388; other != pTVar5; other = other + 1) {
            cpsm::Thread::Thread(this,other);
            cpsm::Thread::~Thread(other);
            this = this + 1;
            __args = extraout_RDX_03;
          }
          if (local_388 != (Thread *)0x0) {
            operator_delete(local_388);
            __args = extraout_RDX_04;
          }
          local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pTVar19 + uVar24;
          local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
          super__Vector_impl_data._M_start = pTVar19;
        }
        else {
          std::allocator_traits<std::allocator<cpsm::Thread>>::
          construct<cpsm::Thread,cpsm::detail::for_each_match<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits,cpsm::StringRefItem,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,main::__0>(boost::basic_string_ref<char,std::char_traits<char>>,cpsm::Options_const&,cpsm::RangeSource<cpsm::StringRefItem,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>&&,main::__0&&)::_lambda()_1_>
                    ((allocator_type *)
                     local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Thread *)local_2d0,__args);
          __args = extraout_RDX_00;
          this = local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        }
        local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
        super__Vector_impl_data._M_finish = this + 1;
        uVar23 = uVar23 + 1;
      } while (uVar23 < (uint)local_380.string_key.field_2._12_4_);
    }
    if (local_380.string_key.field_2._12_4_ == 0) {
      __n = 0;
    }
    else {
      lVar25 = 0;
      uVar24 = 0;
      __n = 0;
      do {
        pTVar5 = local_3a8.super__Vector_base<cpsm::Thread,_std::allocator<cpsm::Thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::thread::join();
        if ((&pTVar5->has_exception_msg_)[lVar25 * 2] == true) {
          pEVar20 = (Error *)__cxa_allocate_exception(0x28);
          local_2d0._0_8_ = local_2d0 + 0x10;
          lVar3 = *(long *)((long)&(pTVar5->exception_msg_)._M_dataplus._M_p + lVar25 * 2);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2d0,lVar3,
                     *(long *)((long)&(pTVar5->exception_msg_)._M_string_length + lVar25 * 2) +
                     lVar3);
          cpsm::Error::Error<std::__cxx11::string>
                    (pEVar20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2d0);
          __cxa_throw(pEVar20,&cpsm::Error::typeinfo,cpsm::Error::~Error);
        }
        info = (code *)((*(long *)((long)&(local_380.original_tokens.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish)->
                                          _M_string_length + lVar25) -
                         *(long *)((long)&(((_Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                                             *)&(local_380.original_tokens.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish)->
                                                _M_dataplus)->_M_impl).super__Vector_impl_data.
                                          _M_start + lVar25) >> 3) * -0x5555555555555555);
        __n = __n + (long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            info)->_M_dataplus)._M_p;
        uVar24 = uVar24 + 1;
        lVar25 = lVar25 + 0x18;
      } while (uVar24 < (ulong)local_380.string_key.field_2._8_8_ >> 0x20);
    }
    local_3c8.
    super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (Matched<cpsm::StringRefItem> *)0x0;
    local_3c8.
    super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Matched<cpsm::StringRefItem> *)0x0;
    local_3c8.
    super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
    ::reserve(&local_3c8,__n);
    __first._M_current =
         local_3c8.
         super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         local_3c8.
         super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    for (__c = local_380.original_tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        local_3c8.
        super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
        ._M_impl.super__Vector_impl_data._M_start = __first._M_current,
        local_3c8.
        super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = __last._M_current,
        __c != local_380.original_tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __c = (pointer)((__c->field_2)._M_local_buf + 8)) {
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<cpsm::detail::Matched<cpsm::StringRefItem>*,std::back_insert_iterator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>>
                ((((_Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                    *)&__c->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start,
                 (Matched<cpsm::StringRefItem> *)__c->_M_string_length,&local_3c8);
      if ((pointer)(__c->field_2)._M_allocated_capacity != (pointer)__c->_M_string_length) {
        std::
        __shrink_to_fit_aux<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_true>
        ::_S_do_it((vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                    *)__c);
      }
      __first._M_current =
           local_3c8.
           super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           local_3c8.
           super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_380.string_key.field_2._M_allocated_capacity ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
       (info = (code *)(((long)__last._M_current - (long)__first._M_current >> 3) *
                       -0x5555555555555555),
       info <= local_380.string_key.field_2._M_allocated_capacity)) {
      if (__first._M_current != __last._M_current) {
        uVar24 = ((long)__last._M_current - (long)__first._M_current >> 3) * -0x5555555555555555;
        lVar25 = 0x3f;
        if (uVar24 != 0) {
          for (; uVar24 >> lVar25 == 0; lVar25 = lVar25 + -1) {
          }
        }
        info = cpsm::detail::Matched<cpsm::StringRefItem>::is_better;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                  (__first,__last,(ulong)(((uint)lVar25 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                    )0x115b88);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                  (__first,__last,
                   (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                    )0x115b88);
      }
    }
    else {
      __middle._M_current = __first._M_current + local_380.string_key.field_2._M_allocated_capacity;
      info = cpsm::detail::Matched<cpsm::StringRefItem>::is_better;
      local_2d0._0_8_ = cpsm::detail::Matched<cpsm::StringRefItem>::is_better;
      std::
      __heap_select<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                (__first,__middle,__last,
                 (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                  )0x115b88);
      std::
      __sort_heap<__gnu_cxx::__normal_iterator<cpsm::detail::Matched<cpsm::StringRefItem>*,std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cpsm::detail::Matched<cpsm::StringRefItem>const&,cpsm::detail::Matched<cpsm::StringRefItem>const&)>>
                (__first,__middle,
                 (_Iter_comp_iter<bool_(*)(const_cpsm::detail::Matched<cpsm::StringRefItem>_&,_const_cpsm::detail::Matched<cpsm::StringRefItem>_&)>
                  *)local_2d0);
      std::
      vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
      ::resize(&local_3c8,local_380.string_key.field_2._M_allocated_capacity);
    }
    pMVar4 = local_3c8.
             super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar22 = local_3c8.
              super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_380.position_key._2_1_ == '\x01') {
      query_00.len_ = local_2f0.field_2._8_8_;
      query_00.ptr_ = (char *)local_2f0.field_2._M_allocated_capacity;
      opts_00 = &local_380.value;
      cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::Matcher
                ((Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *)local_2d0,query_00,
                 (MatcherOptions *)opts_00);
      pMVar4 = local_3c8.
               super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_3c8.
          super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_3c8.
          super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pMVar26 = local_3c8.
                  super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          bVar7 = cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::match
                            ((Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *)
                             local_2d0,(pMVar26->item).item_);
          if (!bVar7) {
            pEVar20 = (Error *)__cxa_allocate_exception(0x28);
            cpsm::Error::
            Error<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
                      (pEVar20,"failed to re-match known match \'",(pMVar26->item).item_,
                       "\' during match position collection");
            __cxa_throw(pEVar20,&cpsm::Error::typeinfo,cpsm::Error::~Error);
          }
          item.item_.len_ = (size_t)local_2d0;
          item.item_.ptr_ = (char *)(pMVar26->item).item_.len_;
          main::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)(pMVar26->item).item_.ptr_,item,(MatchInfo *)opts_00
                    );
          pMVar26 = pMVar26 + 1;
        } while (pMVar26 != pMVar4);
      }
      local_2d0._0_8_ = &PTR__Matcher_00120d10;
      if (local_1e8 != (pointer)0x0) {
        operator_delete(local_1e8);
      }
      if (local_210 != (pointer)0x0) {
        operator_delete(local_210);
      }
      if (local_238 != (pointer)0x0) {
        operator_delete(local_238);
      }
      if (local_288 != (pointer)0x0) {
        operator_delete(local_288);
      }
      if (local_2a8._M_id._M_thread != 0) {
        operator_delete((void *)local_2a8._M_id._M_thread);
      }
      if ((basic_option<char> *)local_2d0._8_8_ != (basic_option<char> *)0x0) {
        operator_delete((void *)local_2d0._8_8_);
      }
    }
    else {
      for (; pMVar22 != pMVar4; pMVar22 = pMVar22 + 1) {
        item_00.item_.len_ = 0;
        item_00.item_.ptr_ = (char *)(pMVar22->item).item_.len_;
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(pMVar22->item).item_.ptr_,item_00,(MatchInfo *)info);
      }
    }
    if (local_3c8.
        super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (Matched<cpsm::StringRefItem> *)0x0) {
      operator_delete(local_3c8.
                      super__Vector_base<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<cpsm::Thread,_std::allocator<cpsm::Thread>_>::~vector(&local_3a8);
    std::
    vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
    ::~vector((vector<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>,_std::allocator<std::vector<cpsm::detail::Matched<cpsm::StringRefItem>,_std::allocator<cpsm::detail::Matched<cpsm::StringRefItem>_>_>_>_>
               *)((long)&local_380.original_tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + 8));
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198);
  }
  else {
    plVar12 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)local_d8);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
  }
  local_178._0_8_ = std::ios::clear;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)(local_178 + 0x10));
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_70);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98);
    local_98 = (void *)0x0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    local_78 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_b0);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::cin.sync_with_stdio(false);
  std::cout.sync_with_stdio(false);
  std::cerr.sync_with_stdio(false);

  po::options_description opts_desc("Options");
  opts_desc.add_options()
      ("crfile", po::value<std::string>()->default_value(""),
       "'currently open file' passed to the matcher")
      ("limit", po::value<std::size_t>()->default_value(10),
       "maximum number of matches to return")
      ("query", po::value<std::string>()->default_value(""),
       "query to match items against")
      ("help", "display this help and exit")
      ;

  po::variables_map opts;
  po::store(po::parse_command_line(argc, argv, opts_desc), opts);
  po::notify(opts);

  if (opts.count("help")) {
    std::cout << opts_desc << std::endl;
    return 0;
  }

  std::vector<std::string> lines;
  std::string line;
  while (std::getline(std::cin, line)) {
    lines.emplace_back(std::move(line));
    line.clear();
  }

  auto const crfile = opts["crfile"].as<std::string>();
  auto const limit = opts["limit"].as<std::size_t>();
  auto const query = opts["query"].as<std::string>();
  auto const mopts =
      cpsm::Options().set_crfile(crfile).set_limit(limit).set_want_match_info(
          true);
  cpsm::for_each_match<cpsm::StringRefItem>(
      query, mopts, cpsm::source_from_range<cpsm::StringRefItem>(lines.cbegin(),
                                                                 lines.cend()),
      [&](cpsm::StringRefItem item, cpsm::MatchInfo const* info) {
        std::cout << item.item() << "\n- score: " << info->score() << "; "
                  << info->score_debug_string() << "\n- match positions: "
                  << cpsm::str_join(info->match_positions(), ", ") << std::endl;
      });

  return 0;
}